

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

PolymorphicMatcher<testing::internal::MatchesRegexMatcher> * __thiscall
testing::ContainsRegex<char_const*>
          (PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *__return_storage_ptr__,
          testing *this,StringLike<const_char_*> *regex)

{
  char *__s;
  RE *this_00;
  allocator<char> local_39;
  string local_38;
  testing *local_18;
  StringLike<const_char_*> *regex_local;
  
  local_18 = this;
  regex_local = (StringLike<const_char_*> *)__return_storage_ptr__;
  this_00 = (RE *)operator_new(0xa8);
  __s = *(char **)local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  internal::RE::RE(this_00,&local_38);
  ContainsRegex(__return_storage_ptr__,this_00);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

PolymorphicMatcher<internal::MatchesRegexMatcher> ContainsRegex(
    const internal::StringLike<T>& regex) {
  return ContainsRegex(new internal::RE(std::string(regex)));
}